

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O2

void __thiscall
DPolyobjInterpolation::DPolyobjInterpolation(DPolyobjInterpolation *this,FPolyObj *po)

{
  DInterpolation::DInterpolation(&this->super_DInterpolation);
  (this->super_DInterpolation).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_00705330;
  (this->oldverts).Array = (double *)0x0;
  (this->oldverts).Most = 0;
  (this->oldverts).Count = 0;
  (this->bakverts).Array = (double *)0x0;
  (this->bakverts).Most = 0;
  (this->bakverts).Count = 0;
  this->poly = po;
  TArray<double,_double>::Resize(&this->oldverts,(po->Vertices).Count * 2);
  TArray<double,_double>::Resize(&this->bakverts,(po->Vertices).Count * 2);
  (*(this->super_DInterpolation).super_DObject._vptr_DObject[7])(this);
  FInterpolator::AddInterpolation(&interpolator,&this->super_DInterpolation);
  return;
}

Assistant:

DPolyobjInterpolation::DPolyobjInterpolation(FPolyObj *po)
{
	poly = po;
	oldverts.Resize(po->Vertices.Size() << 1);
	bakverts.Resize(po->Vertices.Size() << 1);
	UpdateInterpolation ();
	interpolator.AddInterpolation(this);
}